

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbox2d.cpp
# Opt level: O1

obb * __thiscall
masc::polygon::bbox2d::build(obb *__return_storage_ptr__,bbox2d *this,bbox2d_problem *problem)

{
  int iVar1;
  pointer pPVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined4 uVar8;
  uint uVar9;
  int iVar10;
  int i;
  long lVar11;
  int iVar12;
  undefined4 uVar13;
  ulong uVar14;
  int i_3;
  int i_1;
  long lVar15;
  float fVar16;
  double dot;
  double dVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  double dot_1;
  double dVar21;
  int e [4];
  Vector2d nev;
  Vector<double,_2> vec;
  float a [4];
  int local_108 [4];
  Vector2d local_f8;
  Vector<double,_2> local_e8;
  ulong local_d0;
  obb *local_c8;
  bbox2d_problem *local_c0;
  double local_b8 [2];
  Vector<double,_2> local_a8;
  obb local_98;
  float local_48 [6];
  
  local_e8.v[0] = 0.0;
  local_e8.v[1] = 0.0;
  local_f8.v[0] = 0.0;
  local_f8.v[1] = 0.0;
  pPVar2 = (this->m_chull).
           super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d0 = (ulong)((long)(this->m_chull).
                           super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2) >> 4;
  local_108[0] = 0;
  local_98.corners[0].v[0] = 0.0;
  local_98.corners[0].v[1] = 0.0;
  lVar11 = 0;
  do {
    local_98.corners[0].v[lVar11] = pPVar2[1].v[lVar11] - pPVar2->v[lVar11];
    lVar11 = lVar11 + 1;
  } while (lVar11 == 1);
  local_c8 = __return_storage_ptr__;
  mathtool::Vector<double,_2>::normalize(&local_e8);
  local_f8.v[0] = -local_e8.v[1];
  local_f8.v[1] = local_e8.v[0];
  if (2 < (int)(uint)local_d0) {
    pPVar2 = (this->m_chull).
             super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    fVar18 = 3.4028235e+38;
    uVar14 = 2;
    lVar11 = 0x20;
    fVar16 = -3.4028235e+38;
    fVar19 = -3.4028235e+38;
    do {
      local_98.corners[0].v[0] = 0.0;
      local_98.corners[0].v[1] = 0.0;
      lVar15 = 0;
      do {
        local_98.corners[0].v[lVar15] =
             *(double *)((long)pPVar2->v + lVar15 * 8 + lVar11) - pPVar2->v[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 == 1);
      dVar17 = 0.0;
      lVar15 = 0;
      do {
        dVar17 = dVar17 + local_98.corners[0].v[lVar15] * local_e8.v[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 == 1);
      local_98.corners[0].v[0] = 0.0;
      local_98.corners[0].v[1] = 0.0;
      lVar15 = 0;
      do {
        local_98.corners[0].v[lVar15] =
             *(double *)((long)pPVar2->v + lVar15 * 8 + lVar11) - pPVar2->v[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 == 1);
      dVar21 = 0.0;
      lVar15 = 0;
      do {
        dVar21 = dVar21 + local_98.corners[0].v[lVar15] * local_f8.v[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 == 1);
      uVar13 = (undefined4)uVar14;
      fVar20 = (float)dVar17;
      uVar8 = uVar13;
      if (dVar17 <= (double)fVar19) {
        fVar20 = fVar19;
        uVar8 = local_108[1];
      }
      local_108[1] = uVar8;
      fVar19 = (float)dVar17;
      uVar8 = uVar13;
      if ((double)fVar18 <= dVar17) {
        fVar19 = fVar18;
        uVar8 = local_108[3];
      }
      local_108[3] = uVar8;
      fVar18 = fVar19;
      if ((double)fVar16 < dVar21) {
        fVar16 = (float)dVar21;
        local_108[2] = uVar13;
      }
      uVar14 = uVar14 + 1;
      lVar11 = lVar11 + 0x10;
      fVar19 = fVar20;
    } while (uVar14 != ((uint)local_d0 & 0x7fffffff));
  }
  uVar9 = findAngles(this,local_108,local_48,&local_e8,&local_f8);
  if ((this->m_chull).
      super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->m_chull).
      super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar14 = 0;
    local_c0 = problem;
    do {
      createOBB(&local_98,this,local_108,&local_e8,&local_f8);
      iVar10 = (**problem->_vptr_bbox2d_problem)(problem,&local_98);
      if ((char)iVar10 == '\0') {
        iVar1 = local_108[uVar9];
        iVar12 = (iVar1 + 1) % (int)(uint)local_d0;
        pPVar2 = (this->m_chull).
                 super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_b8[0] = 0.0;
        local_b8[1] = 0.0;
        lVar11 = 0;
        do {
          local_b8[lVar11] = pPVar2[iVar12].v[lVar11] - pPVar2[iVar1].v[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 == 1);
        mathtool::Vector<double,_2>::normalize(&local_a8);
        if ((uVar9 & 0xfffffffd) == 0) {
          local_e8.v[0] = local_a8.v[0];
          local_e8.v[1] = local_a8.v[1];
          local_f8.v[0] = -local_a8.v[1];
          local_f8.v[1] = local_a8.v[0];
        }
        else {
          local_f8.v[0] = local_a8.v[0];
          local_f8.v[1] = local_a8.v[1];
          local_e8.v[0] = -local_a8.v[1];
          local_e8.v[1] = local_a8.v[0];
        }
        local_108[uVar9] = iVar12;
        uVar9 = findAngles(this,local_108,local_48,&local_e8,&local_f8);
        problem = local_c0;
      }
    } while (((char)iVar10 == '\0') &&
            (uVar14 = uVar14 + 1,
            uVar14 < (ulong)((long)(this->m_chull).
                                   super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_chull).
                                   super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4)));
  }
  dVar17 = (problem->m_solution).corners[0].v[0];
  dVar21 = (problem->m_solution).corners[0].v[1];
  dVar3 = (problem->m_solution).corners[1].v[0];
  dVar4 = (problem->m_solution).corners[1].v[1];
  dVar5 = (problem->m_solution).corners[2].v[0];
  dVar6 = (problem->m_solution).corners[2].v[1];
  dVar7 = (problem->m_solution).corners[3].v[1];
  local_c8->corners[3].v[0] = (problem->m_solution).corners[3].v[0];
  local_c8->corners[3].v[1] = dVar7;
  local_c8->corners[2].v[0] = dVar5;
  local_c8->corners[2].v[1] = dVar6;
  local_c8->corners[1].v[0] = dVar3;
  local_c8->corners[1].v[1] = dVar4;
  local_c8->corners[0].v[0] = dVar17;
  local_c8->corners[0].v[1] = dVar21;
  fVar19 = (problem->m_solution).height;
  local_c8->width = (problem->m_solution).width;
  local_c8->height = fVar19;
  return local_c8;
}

Assistant:

obb bbox2d::build(bbox2d_problem & problem)
{
  mathtool::Vector2d v,n;
  int e[4]; //vertex indices of extreme points
  float a[4]; //angles
  int w; //index (0~3), so that e[w] has the smallest value a[w]
  int hullsize=m_chull.size();

  //init extreme points
  e[0]=0;
  v=(m_chull[1]-m_chull[0]).normalize();
  n.set(-v[1],v[0]);
  const mathtool::Vector2d v0=v;

  float max_v=-FLT_MAX, min_v=FLT_MAX, max_n=-FLT_MAX;
  for(int i=2;i<hullsize;i++)
  {
    auto& pt=m_chull[i];
    double dv=(pt-m_chull[0])*v;
    double dn=(pt-m_chull[0])*n;
    if(dv>max_v){ max_v=dv; e[1]=i;}
    if(dv<min_v){ min_v=dv; e[3]=i;}
    if(dn>max_n){ max_n=dn; e[2]=i;}
  }
  w=findAngles(e,a,v,n);

  //update extreme points
  char svg_filename[256];

  for(int i=0;i<m_chull.size();i++)
  {
    //create a box from v,n,e[4]
    obb box=createOBB(e,v,n);

#if DEBUG
    cout<<"box="<<box<<endl;
    sprintf(svg_filename, "%s%03d.svg", "DEBUG_",i);
    saveSVG(svg_filename,m_chull_ply,box);
    //saveSVG(svg_filename,m_ply.front(),box);
#endif

    //check if this box solve the problem
    if(problem.solved(box)) break;

    //update
    int ne=(e[w]+1)%hullsize;
    mathtool::Vector2d nev=(m_chull[ne]-m_chull[e[w]]).normalize();
    if(w==0 || w==2)
    {
      v=nev;
      n.set(-v[1],v[0]);
    }
    else{
      n=nev;
      v.set(-n[1],n[0]);
    }
    e[w]=ne;

    w=findAngles(e,a,v,n);
  }

  return problem.getSolution(); //done
}